

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::GeneratorsForTest::moveNext(GeneratorsForTest *this)

{
  bool bVar1;
  uint uVar2;
  reference ppIVar3;
  __normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  local_38;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  local_30;
  const_iterator itEnd;
  __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
  local_20;
  const_iterator it;
  GeneratorsForTest *this_local;
  
  it._M_current = (IGeneratorInfo **)this;
  itEnd._M_current =
       (IGeneratorInfo **)
       std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::begin
                 (&this->m_generatorsInOrder);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            ((__normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
              *)&local_20,
             (__normal_iterator<Catch::IGeneratorInfo_**,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              *)&itEnd);
  local_38._M_current =
       (IGeneratorInfo **)
       std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::end
                 (&this->m_generatorsInOrder);
  __gnu_cxx::
  __normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
  ::__normal_iterator<Catch::IGeneratorInfo**>
            ((__normal_iterator<Catch::IGeneratorInfo*const*,std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) {
      return false;
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
              ::operator*(&local_20);
    uVar2 = (*(*ppIVar3)->_vptr_IGeneratorInfo[2])();
    if ((uVar2 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<Catch::IGeneratorInfo_*const_*,_std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>_>
    ::operator++(&local_20);
  }
  return true;
}

Assistant:

bool moveNext() {
            std::vector<IGeneratorInfo*>::const_iterator it = m_generatorsInOrder.begin();
            std::vector<IGeneratorInfo*>::const_iterator itEnd = m_generatorsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( (*it)->moveNext() )
                    return true;
            }
            return false;
        }